

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knn_graph.h
# Opt level: O1

void __thiscall
gnns::Knn_Graph<L2Distance<float>_>::nth_index_element
          (Knn_Graph<L2Distance<float>_> *this,DistanceType *dist,size_t_conflict length,
          DistanceType *elements,IndexType *indices,size_t_conflict n)

{
  long lVar1;
  pair<float,_unsigned_int> pVar2;
  pair<float,_unsigned_int> *ppVar3;
  size_t_conflict sVar4;
  ulong uVar5;
  ulong uVar6;
  pair<float,_unsigned_int> *ppVar7;
  vector<std::pair<float,_unsigned_int>,_std::allocator<std::pair<float,_unsigned_int>_>_> v;
  pair<float,_unsigned_int> *local_58;
  iterator iStack_50;
  pair<float,_unsigned_int> *local_48;
  pair<float,_unsigned_int> local_40;
  size_t_conflict local_34;
  
  local_58 = (pair<float,_unsigned_int> *)0x0;
  iStack_50._M_current = (pair<float,_unsigned_int> *)0x0;
  local_48 = (pair<float,_unsigned_int> *)0x0;
  local_34 = n;
  if (length != 0) {
    uVar6 = 0;
    do {
      local_40.first = dist[uVar6];
      local_40.second = (uint)uVar6;
      if (iStack_50._M_current == local_48) {
        std::vector<std::pair<float,unsigned_int>,std::allocator<std::pair<float,unsigned_int>>>::
        _M_realloc_insert<std::pair<float,unsigned_int>>
                  ((vector<std::pair<float,unsigned_int>,std::allocator<std::pair<float,unsigned_int>>>
                    *)&local_58,iStack_50,&local_40);
      }
      else {
        pVar2.second = local_40.second;
        pVar2.first = local_40.first;
        *iStack_50._M_current = pVar2;
        iStack_50._M_current = iStack_50._M_current + 1;
      }
      uVar6 = uVar6 + 1;
    } while (length != uVar6);
  }
  sVar4 = local_34;
  uVar6 = (ulong)local_34;
  if (local_58 + uVar6 + 1 != iStack_50._M_current && local_58 != iStack_50._M_current) {
    uVar5 = (long)iStack_50._M_current - (long)local_58 >> 3;
    lVar1 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introselect<__gnu_cxx::__normal_iterator<std::pair<float,unsigned_int>*,std::vector<std::pair<float,unsigned_int>,std::allocator<std::pair<float,unsigned_int>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              ();
  }
  ppVar3 = local_58;
  ppVar7 = local_58 + uVar6 + 1;
  if (local_58 != ppVar7) {
    uVar5 = (long)ppVar7 - (long)local_58 >> 3;
    lVar1 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<float,unsigned_int>*,std::vector<std::pair<float,unsigned_int>,std::allocator<std::pair<float,unsigned_int>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_58,ppVar7,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<float,unsigned_int>*,std::vector<std::pair<float,unsigned_int>,std::allocator<std::pair<float,unsigned_int>>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (ppVar3,ppVar7);
  }
  if (sVar4 != 0) {
    uVar5 = 0;
    do {
      elements[uVar5] = local_58[uVar5 + 1].first;
      indices[uVar5] = local_58[uVar5 + 1].second;
      uVar5 = uVar5 + 1;
    } while (uVar6 != uVar5);
  }
  if (local_58 != (pair<float,_unsigned_int> *)0x0) {
    operator_delete(local_58);
  }
  return;
}

Assistant:

void nth_index_element(DistanceType* dist, const size_t length, DistanceType* elements, IndexType* indices, const size_t n)
        {
            //construct a vector with index
            std::vector<std::pair<DistanceType, IndexType>> v;
            for(int i=0;i<length;++i)
                v.push_back(std::pair<DistanceType, size_t>(dist[i], i));

            //since it contain the point itself and find n+1 minimum elements
            std::nth_element(v.begin(), v.begin()+n+1, v.end());
            std::sort(v.begin(), v.begin()+n+1);
            //eliminate the first element(itself)
            for(size_t i=0;i<n;++i)
            {
                elements[i] = v[i+1].first;
                indices[i] = v[i+1].second;
            }
        }